

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  char *__s;
  char *pcVar1;
  undefined8 uVar2;
  int iVar3;
  int iVar4;
  runtime_error *this;
  long lVar5;
  bool walk_through;
  ulong uVar6;
  pointer __old_p_1;
  Player *pPVar7;
  Player *pPVar8;
  char **ppcVar9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  arguments;
  Game game;
  string turns;
  long *local_f8;
  undefined1 local_f0 [40];
  _Head_base<0UL,_Player_*,_false> local_c8;
  int local_bc;
  undefined1 local_b8 [32];
  vector<std::vector<std::shared_ptr<Piece>,_std::allocator<std::shared_ptr<Piece>_>_>,_std::allocator<std::vector<std::shared_ptr<Piece>,_std::allocator<std::shared_ptr<Piece>_>_>_>_>
  local_98;
  pointer local_78;
  pointer local_68;
  _Head_base<0UL,_Player_*,_false> local_60;
  _Head_base<0UL,_Player_*,_false> local_58;
  string local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  local_bc = argc + -1;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)(local_f0 + 0x10),(long)local_bc,(allocator_type *)local_b8);
  if (1 < argc) {
    ppcVar9 = argv + 1;
    lVar5 = 0;
    do {
      __s = *ppcVar9;
      pcVar1 = *(char **)(local_f0._16_8_ + 8 + lVar5);
      uVar6 = local_f0._16_8_ + lVar5;
      strlen(__s);
      std::__cxx11::string::_M_replace(uVar6,0,pcVar1,(ulong)__s);
      ppcVar9 = ppcVar9 + 1;
      lVar5 = lVar5 + 0x20;
    } while ((ulong)(uint)argc * 0x20 + -0x20 != lVar5);
  }
  iVar4 = 0;
  walk_through = false;
  if (argc < 2) {
    local_f8 = (long *)0x0;
    pPVar7 = (Player *)0x0;
  }
  else {
    walk_through = false;
    local_f8 = (long *)0x0;
    pPVar8 = (Player *)0x0;
    do {
      lVar5 = (long)iVar4 * 0x20;
      iVar3 = std::__cxx11::string::compare((char *)(local_f0._16_8_ + lVar5));
      if (iVar3 == 0) {
        create_player((string *)local_b8);
        pPVar7 = (Player *)local_b8._0_8_;
        local_b8._0_8_ = (long *)0x0;
        if (pPVar8 != (Player *)0x0) {
          (*pPVar8->_vptr_Player[1])(pPVar8);
        }
        if ((long *)local_b8._0_8_ != (long *)0x0) {
          (**(code **)(*(long *)local_b8._0_8_ + 8))();
        }
        iVar4 = iVar4 + 1;
      }
      else {
        iVar3 = std::__cxx11::string::compare((char *)(local_f0._16_8_ + lVar5));
        pPVar7 = pPVar8;
        if (iVar3 == 0) {
          create_player((string *)local_b8);
          uVar2 = local_b8._0_8_;
          local_b8._0_8_ = (long *)0x0;
          if (local_f8 != (long *)0x0) {
            (**(code **)(*local_f8 + 8))();
          }
          if ((long *)local_b8._0_8_ != (long *)0x0) {
            (**(code **)(*(long *)local_b8._0_8_ + 8))();
          }
          iVar4 = iVar4 + 1;
          local_f8 = (long *)uVar2;
        }
        else {
          iVar3 = std::__cxx11::string::compare((char *)(local_f0._16_8_ + lVar5));
          if (iVar3 == 0) {
            std::__cxx11::string::_M_assign((string *)&local_50);
            iVar4 = iVar4 + 1;
          }
          else {
            iVar3 = std::__cxx11::string::compare((char *)(local_f0._16_8_ + lVar5));
            walk_through = true;
            if (iVar3 != 0) {
              iVar4 = std::__cxx11::string::compare((char *)(local_f0._16_8_ + lVar5));
              if ((iVar4 != 0) &&
                 (iVar4 = std::__cxx11::string::compare((char *)(local_f0._16_8_ + lVar5)),
                 iVar4 != 0)) {
                this = (runtime_error *)__cxa_allocate_exception(0x10);
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_b8,"Unknown argument ",
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               (lVar5 + local_f0._16_8_));
                std::runtime_error::runtime_error(this,(string *)local_b8);
                __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,
                         "Usage: chess [--white (local|client|server)[:IP:PORT]] [--black (local|client|server)[:IP:PORT]]"
                         ,0x60);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout," [--turns [e2e4 ...]] [--walk-through]",0x26);
              std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
              std::ostream::put('h');
              std::ostream::flush();
              goto LAB_00104582;
            }
          }
        }
      }
      iVar4 = iVar4 + 1;
      pPVar8 = pPVar7;
    } while (iVar4 < local_bc);
  }
  if (pPVar7 == (Player *)0x0) {
    local_b8._0_8_ = local_b8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"local","");
    create_player((string *)local_f0);
    pPVar7 = (Player *)local_f0._0_8_;
    local_f0._0_8_ = (long *)0x0;
    if ((undefined1 *)local_b8._0_8_ != local_b8 + 0x10) {
      operator_delete((void *)local_b8._0_8_,local_b8._16_8_ + 1);
    }
  }
  if (local_f8 == (long *)0x0) {
    local_b8._0_8_ = local_b8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"local","");
    create_player((string *)local_f0);
    local_f8 = (long *)local_f0._0_8_;
    local_f0._0_8_ = (long *)0x0;
    if ((undefined1 *)local_b8._0_8_ != local_b8 + 0x10) {
      operator_delete((void *)local_b8._0_8_,local_b8._16_8_ + 1);
    }
  }
  local_f0._8_8_ = local_f8;
  local_c8._M_head_impl = pPVar7;
  Game::Game((Game *)local_b8,(unique_ptr<Player,_std::default_delete<Player>_> *)&local_c8,
             (unique_ptr<Player,_std::default_delete<Player>_> *)(local_f0 + 8),walk_through,
             &local_50);
  if ((long *)local_f0._8_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_f0._8_8_ + 8))();
  }
  local_f0._8_8_ = 0;
  if (local_c8._M_head_impl != (Player *)0x0) {
    (*(local_c8._M_head_impl)->_vptr_Player[1])();
  }
  local_c8._M_head_impl = (Player *)0x0;
  Game::play_game((Game *)local_b8);
  if ((_Head_base<0UL,_Player_*,_false>)local_58._M_head_impl !=
      (_Head_base<0UL,_Player_*,_false>)0x0) {
    (*(local_58._M_head_impl)->_vptr_Player[1])();
  }
  local_58._M_head_impl = (Player *)0x0;
  if (local_60._M_head_impl != (Player *)0x0) {
    (*(local_60._M_head_impl)->_vptr_Player[1])();
  }
  local_60._M_head_impl = (Player *)0x0;
  if (local_78 != (pointer)0x0) {
    operator_delete(local_78,(long)local_68 - (long)local_78);
  }
  std::
  vector<std::vector<std::shared_ptr<Piece>,_std::allocator<std::shared_ptr<Piece>_>_>,_std::allocator<std::vector<std::shared_ptr<Piece>,_std::allocator<std::shared_ptr<Piece>_>_>_>_>
  ::~vector(&local_98);
  if ((pointer)local_b8._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_b8._8_8_,local_b8._24_8_ - local_b8._8_8_);
  }
  local_f8 = (long *)0x0;
  pPVar8 = (Player *)0x0;
LAB_00104582:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_f0 + 0x10));
  if (local_f8 != (long *)0x0) {
    (**(code **)(*local_f8 + 8))(local_f8);
  }
  if (pPVar8 != (Player *)0x0) {
    (*pPVar8->_vptr_Player[1])(pPVar8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,
                    CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                             local_50.field_2._M_local_buf[0]) + 1);
  }
  return 0;
}

Assistant:

int main(int argc, char *argv[]) {
    // Set default game settings.
    bool walk_through = false;
    string turns;
    unique_ptr<Player> white;
    unique_ptr<Player> black;

    // Parse arguments.
    vector<string> arguments(argc - 1);
    for (int i = 1; i < argc; i++) {
        arguments[i - 1] = argv[i];
    }
    for (int index = 0; index < argc - 1; index++) {
        if (arguments[index] == "--white") {
            // White player definition.
            white = create_player(arguments[index + 1]);
            index++;
        } else if (arguments[index] == "--black") {
            // Black player definition.
            black = create_player(arguments[index + 1]);
            index++;
        } else if (arguments[index] == "--turns") {
            // Pre turns definition.
            turns = arguments[index + 1];
            index++;
        } else if (arguments[index] == "--walk-through") {
            // Walk through pre turns.
            walk_through = true;
        } else if ((arguments[index] == "-h") || (arguments[index] == "--help")) {
            // Display help.
            cout << "Usage: chess [--white (local|client|server)[:IP:PORT]] [--black (local|client|server)[:IP:PORT]]"
                 << " [--turns [e2e4 ...]] [--walk-through]" << endl;
            return 0;
        } else {
            // Unknown argument.
            throw runtime_error("Unknown argument " + arguments[index]);
        }
    }

    // Fallback default players if not specified.
    if (white == nullptr) {
        white = create_player("local");
    }
    if (black == nullptr) {
        black = create_player("local");
    }

    // Initialize the game.
    Game game(move(white), move(black), walk_through, turns);

    // Play.
    game.play_game();

    return 0;
}